

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastq_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserFastqTest_ParseWhole_Test::TestBody
          (BioparserFastqTest_ParseWhole_Test *this)

{
  pointer pPVar1;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  local_60;
  allocator local_31;
  string local_30;
  BioparserFastqTest_ParseWhole_Test *local_10;
  BioparserFastqTest_ParseWhole_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"sample.fastq",&local_31);
  BioparserFastqTest::Setup(&this->super_BioparserFastqTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar1 = std::
           unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ::operator->(&(this->super_BioparserFastqTest).p);
  (*pPVar1->_vptr_Parser[2])(&local_60,pPVar1,0xffffffffffffffff,1);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::operator=(&(this->super_BioparserFastqTest).s,&local_60);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector(&local_60);
  BioparserFastqTest::Check(&this->super_BioparserFastqTest);
  return;
}

Assistant:

TEST_F(BioparserFastqTest, ParseWhole) {
  Setup("sample.fastq");
  s = p->Parse(-1);
  Check();
}